

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O2

put_transaction<density_tests::TestObject<128UL,_8UL>_> * __thiscall
density::
heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<256ul>>
::start_emplace<density_tests::TestObject<128ul,8ul>,density_tests::TestObject<128ul,8ul>>
          (put_transaction<density_tests::TestObject<128UL,_8UL>_> *__return_storage_ptr__,
          heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<256ul>>
          *this,TestObject<128UL,_8UL> *i_construction_params)

{
  uintptr_t uint_pointer;
  Allocation AVar1;
  put_transaction<density_tests::TestObject<128UL,_8UL>_> local_48;
  
  AVar1 = inplace_allocate<0ul,true,128ul,8ul>(this);
  density_tests::
  TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>
  ::make<density_tests::TestObject<128ul,8ul>>();
  density_tests::TestObject<128UL,_8UL>::TestObject
            ((TestObject<128UL,_8UL> *)AVar1.m_user_storage,i_construction_params);
  __return_storage_ptr__->m_queue =
       (heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_> *)
       this;
  local_48.m_put_data.m_control_block = AVar1.m_control_block;
  (__return_storage_ptr__->m_put_data).m_control_block = local_48.m_put_data.m_control_block;
  (__return_storage_ptr__->m_put_data).m_user_storage =
       (TestObject<128UL,_8UL> *)AVar1.m_user_storage;
  local_48.m_queue =
       (heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_> *)
       0x0;
  local_48.m_put_data = AVar1;
  heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>_>
  ::put_transaction<density_tests::TestObject<128UL,_8UL>_>::~put_transaction(&local_48);
  return __return_storage_ptr__;
}

Assistant:

put_transaction<ELEMENT_TYPE> start_emplace(CONSTRUCTION_PARAMS &&... i_construction_params)
        {
            auto push_data = inplace_allocate<
              0,
              true,
              detail::size_of<ELEMENT_TYPE>::value,
              alignof(ELEMENT_TYPE)>();

            RUNTIME_TYPE * type = nullptr;
            try
            {
                auto const type_storage = type_after_control(push_data.m_control_block);
                DENSITY_ASSUME(type_storage != nullptr);
                type = new (type_storage) RUNTIME_TYPE(RUNTIME_TYPE::template make<ELEMENT_TYPE>());

                DENSITY_ASSUME(push_data.m_user_storage != nullptr);
                new (push_data.m_user_storage)
                  ELEMENT_TYPE(std::forward<CONSTRUCTION_PARAMS>(i_construction_params)...);
            }
            catch (...)
            {
                if (type != nullptr)
                    type->RUNTIME_TYPE::~RUNTIME_TYPE();
                DENSITY_ASSERT_INTERNAL(
                  (push_data.m_control_block->m_next & (detail::Queue_Busy | detail::Queue_Dead)) ==
                  0);
                push_data.m_control_block->m_next += detail::Queue_Dead;
                throw;
            }

            return put_transaction<ELEMENT_TYPE>(PrivateType(), this, push_data);
        }